

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.h
# Opt level: O1

clock_t __thiscall EnvelopeGenerator::clock(EnvelopeGenerator *this)

{
  int iVar1;
  ulong in_RAX;
  uint uVar2;
  int iVar3;
  State SVar4;
  reg8 rVar5;
  uint uVar6;
  int in_ESI;
  byte bVar7;
  
  if (in_ESI != 0) {
    uVar6 = this->rate_period;
    in_RAX = (ulong)uVar6;
    iVar3 = uVar6 - this->rate_counter;
    iVar1 = (uVar6 + 0x7fff) - this->rate_counter;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    SVar4 = this->state;
    bVar7 = this->hold_zero;
    do {
      iVar3 = in_ESI - iVar1;
      if (in_ESI < iVar1) {
        uVar2 = this->rate_counter + in_ESI;
        uVar6 = this->rate_counter + in_ESI + 1 & 0x7fff;
        if (-1 < (short)uVar2) {
          uVar6 = uVar2;
        }
        this->rate_counter = uVar6;
        return (ulong)uVar6;
      }
      this->rate_counter = 0;
      if (((SVar4 == ATTACK) ||
          (rVar5 = this->exponential_counter + 1, this->exponential_counter = rVar5,
          rVar5 == this->exponential_counter_period)) &&
         (this->exponential_counter = 0, (bVar7 & 1) == 0)) {
        if (SVar4 == RELEASE) {
          uVar6 = this->envelope_counter - 1 & 0xff;
LAB_0016a10d:
          this->envelope_counter = uVar6;
        }
        else if (SVar4 == DECAY_SUSTAIN) {
          if (this->envelope_counter != sustain_level[this->sustain]) {
            uVar6 = this->envelope_counter - 1;
            goto LAB_0016a10d;
          }
        }
        else if ((SVar4 == ATTACK) &&
                (uVar6 = this->envelope_counter + 1 & 0xff, this->envelope_counter = uVar6,
                uVar6 == 0xff)) {
          this->state = DECAY_SUSTAIN;
          in_RAX = (ulong)rate_counter_period[this->decay];
          this->rate_period = rate_counter_period[this->decay];
          SVar4 = DECAY_SUSTAIN;
        }
        rVar5 = this->envelope_counter;
        if ((int)rVar5 < 0x1a) {
          if (rVar5 == 0) {
            this->exponential_counter_period = 1;
            this->hold_zero = true;
            bVar7 = 1;
          }
          else if (rVar5 == 6) {
            this->exponential_counter_period = 0x1e;
          }
          else if (rVar5 == 0xe) {
            this->exponential_counter_period = 0x10;
          }
        }
        else if ((int)rVar5 < 0x5d) {
          if (rVar5 == 0x1a) {
            this->exponential_counter_period = 8;
          }
          else if (rVar5 == 0x36) {
            this->exponential_counter_period = 4;
          }
        }
        else if (rVar5 == 0x5d) {
          this->exponential_counter_period = 2;
        }
        else if (rVar5 == 0xff) {
          this->exponential_counter_period = 1;
        }
      }
      iVar1 = (int)in_RAX;
      in_ESI = iVar3;
    } while (iVar3 != 0);
  }
  return in_RAX;
}

Assistant:

RESID_INLINE
void EnvelopeGenerator::clock(cycle_count delta_t)
{
  // Check for ADSR delay bug.
  // If the rate counter comparison value is set below the current value of the
  // rate counter, the counter will continue counting up until it wraps around
  // to zero at 2^15 = 0x8000, and then count rate_period - 1 before the
  // envelope can finally be stepped.
  // This has been verified by sampling ENV3.
  //

  // NB! This requires two's complement integer.
  int rate_step = rate_period - rate_counter;
  if (rate_step <= 0) {
    rate_step += 0x7fff;
  }

  while (delta_t) {
    if (delta_t < rate_step) {
      rate_counter += delta_t;
      if (rate_counter & 0x8000) {
	++rate_counter &= 0x7fff;
      }
      return;
    }

    rate_counter = 0;
    delta_t -= rate_step;

    // The first envelope step in the attack state also resets the exponential
    // counter. This has been verified by sampling ENV3.
    //
    if (state == ATTACK	|| ++exponential_counter == exponential_counter_period)
    {
      exponential_counter = 0;

      // Check whether the envelope counter is frozen at zero.
      if (hold_zero) {
	rate_step = rate_period;
	continue;
      }

      switch (state) {
      case ATTACK:
	// The envelope counter can flip from 0xff to 0x00 by changing state to
	// release, then to attack. The envelope counter is then frozen at
	// zero; to unlock this situation the state must be changed to release,
	// then to attack. This has been verified by sampling ENV3.
	//
	++envelope_counter &= 0xff;
	if (envelope_counter == 0xff) {
	  state = DECAY_SUSTAIN;
	  rate_period = rate_counter_period[decay];
	}
	break;
      case DECAY_SUSTAIN:
	if (envelope_counter != sustain_level[sustain]) {
	  --envelope_counter;
	}
	break;
      case RELEASE:
	// The envelope counter can flip from 0x00 to 0xff by changing state to
	// attack, then to release. The envelope counter will then continue
	// counting down in the release state.
	// This has been verified by sampling ENV3.
	// NB! The operation below requires two's complement integer.
	//
	--envelope_counter &= 0xff;
	break;
      }

      // Check for change of exponential counter period.
      switch (envelope_counter) {
      case 0xff:
	exponential_counter_period = 1;
	break;
      case 0x5d:
	exponential_counter_period = 2;
	break;
      case 0x36:
	exponential_counter_period = 4;
	break;
      case 0x1a:
	exponential_counter_period = 8;
	break;
      case 0x0e:
	exponential_counter_period = 16;
	break;
      case 0x06:
	exponential_counter_period = 30;
	break;
      case 0x00:
	exponential_counter_period = 1;

	// When the envelope counter is changed to zero, it is frozen at zero.
	// This has been verified by sampling ENV3.
	hold_zero = true;
	break;
      }
    }

    rate_step = rate_period;
  }
}